

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

deBool vk::BinaryRegistryDetail::BinaryIndexHashImpl_insert
                 (BinaryIndexHashImpl *hash,ProgramBinary *key,deUint32 value)

{
  int iVar1;
  pointer puVar2;
  deBool dVar3;
  deUint32 dVar4;
  BinaryIndexHashImplSlot *pBVar5;
  BinaryIndexHashImplSlot *pBVar6;
  int iVar7;
  uint uVar8;
  size_t numBytes;
  pointer ptr;
  
  iVar1 = hash->slotTableSize;
  iVar7 = hash->numElements + 1;
  if (SBORROW4(iVar7,iVar1 * 4) == iVar7 + iVar1 * -4 < 0) {
    iVar7 = 4;
    if (4 < iVar1 * 2) {
      iVar7 = iVar1 * 2;
    }
    dVar3 = BinaryIndexHashImpl_rehash(hash,iVar7);
    if (dVar3 == 0) {
      return 0;
    }
  }
  puVar2 = (key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  numBytes = (long)(key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  ptr = (pointer)0x0;
  if (numBytes != 0) {
    ptr = puVar2;
  }
  dVar4 = deMemoryHash(ptr,numBytes);
  uVar8 = hash->slotTableSize - 1U & dVar4;
  pBVar5 = hash->slotTable[(int)uVar8];
  if (pBVar5 == (BinaryIndexHashImplSlot *)0x0) {
    pBVar5 = BinaryIndexHashImpl_allocSlot(hash);
    if (pBVar5 == (BinaryIndexHashImplSlot *)0x0) {
      return 0;
    }
    hash->slotTable[(int)uVar8] = pBVar5;
  }
  iVar1 = pBVar5->numUsed;
  do {
    if (iVar1 != 4) {
      pBVar5->keys[iVar1] = key;
      pBVar5->values[iVar1] = value;
      pBVar5->numUsed = pBVar5->numUsed + 1;
      hash->numElements = hash->numElements + 1;
      return 1;
    }
    pBVar6 = pBVar5->nextSlot;
    if (pBVar6 == (BinaryIndexHashImplSlot *)0x0) {
      pBVar6 = BinaryIndexHashImpl_allocSlot(hash);
      if (pBVar6 == (BinaryIndexHashImplSlot *)0x0) {
        return 0;
      }
      pBVar5->nextSlot = pBVar6;
    }
    iVar1 = pBVar6->numUsed;
    pBVar5 = pBVar6;
  } while( true );
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}